

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdCreateSighash(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                    int hash_type,char *pubkey,char *redeem_script,int64_t value_satoshi,
                    int sighash_type,bool sighash_anyone_can_pay,char **sighash)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  OutPoint *in_RCX;
  char *in_RDX;
  uint32_t in_R8D;
  char *in_stack_00000008;
  SigHashType *in_stack_00000010;
  int64_t in_stack_00000018;
  uint8_t in_stack_00000020;
  byte in_stack_00000028;
  undefined8 *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_3;
  TransactionContext tx_2;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  SigHashType sighashtype;
  ByteData sighash_bytes;
  Amount value;
  bool is_bitcoin;
  WitnessVersion version;
  HashType core_hash_type;
  AddressType addr_type;
  undefined4 in_stack_fffffffffffff518;
  undefined4 in_stack_fffffffffffff51c;
  ConfidentialTransactionContext *in_stack_fffffffffffff520;
  string *in_stack_fffffffffffff530;
  undefined8 in_stack_fffffffffffff538;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff540;
  allocator *paVar5;
  string *in_stack_fffffffffffff548;
  ConfidentialTransactionContext *in_stack_fffffffffffff550;
  bool *in_stack_fffffffffffff578;
  string *in_stack_fffffffffffff580;
  undefined7 in_stack_fffffffffffff5a8;
  undefined1 in_stack_fffffffffffff5af;
  SigHashType *in_stack_fffffffffffff5b0;
  Script *in_stack_fffffffffffff5b8;
  Script *redeem_script_00;
  OutPoint *in_stack_fffffffffffff5c0;
  ConfidentialTransactionContext *in_stack_fffffffffffff5c8;
  ConfidentialTransactionContext *this;
  WitnessVersion in_stack_fffffffffffff5e0;
  WitnessVersion version_00;
  Amount *in_stack_fffffffffffff5e8;
  SigHashType *in_stack_fffffffffffff5f0;
  Pubkey *in_stack_fffffffffffff5f8;
  OutPoint *in_stack_fffffffffffff600;
  TransactionContext *in_stack_fffffffffffff608;
  WitnessVersion in_stack_fffffffffffff620;
  string local_968;
  SigHashType local_948;
  allocator local_939;
  string local_938;
  Pubkey local_918;
  allocator local_8f9;
  string local_8f8;
  Txid local_8d8;
  OutPoint local_8b8;
  ByteData local_890;
  allocator local_871;
  string local_870 [248];
  SigHashType local_778;
  allocator local_769;
  string local_768;
  Pubkey local_748;
  string local_729;
  Txid local_708;
  OutPoint local_6e8;
  ByteData local_6c0;
  allocator local_6a1;
  string local_6a0 [222];
  undefined1 local_5c2;
  allocator local_5c1;
  string local_5c0 [32];
  CfdSourceLocation local_5a0;
  SigHashType local_588;
  Script local_579;
  undefined1 local_519 [136];
  allocator local_491;
  string local_490 [248];
  SigHashType local_398;
  allocator local_389;
  string local_388;
  Script local_368;
  allocator local_329;
  string local_328;
  Txid local_308;
  OutPoint local_2e8;
  ByteData local_2c0;
  allocator local_2a1;
  string local_2a0 [222];
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  CfdSourceLocation local_1a0;
  SigHashType local_184;
  ByteData local_178;
  Amount local_160;
  byte local_14b;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [32];
  CfdSourceLocation local_128;
  undefined4 local_110;
  int local_10c;
  AddressType local_108;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  byte local_31;
  uint32_t local_2c;
  OutPoint *local_28;
  char *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff538 >> 0x20);
  local_31 = in_stack_00000028 & 1;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x922;
    local_60.funcname = "CfdCreateSighash";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff540,error_code,in_stack_fffffffffffff530);
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString((char *)local_28);
  if (!bVar1) {
    if (in_stack_00000030 == (undefined8 *)0x0) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x92e;
      local_e0.funcname = "CfdCreateSighash";
      cfd::core::logger::warn<>(&local_e0,"sighash is null.");
      local_102 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Failed to parameter. sighash is null.",&local_101);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff540,error_code,in_stack_fffffffffffff530);
      local_102 = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_108 = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff580 >> 0x20))
    ;
    local_110 = 0xffffffff;
    switch(local_108) {
    case kP2shAddress:
      local_10c = 1;
      break;
    case kP2pkhAddress:
      local_10c = 0;
      break;
    case kP2wshAddress:
    case kP2shP2wshAddress:
      local_10c = 3;
      local_110 = 0;
      break;
    case kP2wpkhAddress:
    case kP2shP2wpkhAddress:
      local_10c = 2;
      local_110 = 0;
      break;
    default:
      local_128.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_128.filename = local_128.filename + 1;
      local_128.line = 0x94b;
      local_128.funcname = "CfdCreateSighash";
      cfd::core::logger::warn<>(&local_128,"hashtype is illegal.");
      local_14a = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Failed to parameter. hashtype is illegal.",&local_149)
      ;
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff540,error_code,in_stack_fffffffffffff530);
      local_14a = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_14b = 0;
    cfd::capi::ConvertNetType
              ((int)((ulong)in_stack_fffffffffffff580 >> 0x20),in_stack_fffffffffffff578);
    cfd::core::Amount::Amount(&local_160,in_stack_00000018);
    cfd::core::ByteData::ByteData(&local_178);
    cfd::core::SigHashType::Create(&local_184,in_stack_00000020,(bool)(local_31 & 1),false);
    if ((local_10c == 1) || (local_10c == 3)) {
      bVar1 = cfd::capi::IsEmptyString((char *)in_stack_00000010);
      if (bVar1) {
        local_1a0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        local_1a0.filename = local_1a0.filename + 1;
        local_1a0.line = 0x95a;
        local_1a0.funcname = "CfdCreateSighash";
        cfd::core::logger::warn<>(&local_1a0,"redeem script is null or empty.");
        local_1c2 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1c0,"Failed to parameter. redeem script is null or empty.",&local_1c1);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffff540,error_code,in_stack_fffffffffffff530);
        local_1c2 = 0;
        __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      if ((local_14b & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_490,local_20,&local_491);
        cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                  (in_stack_fffffffffffff550,in_stack_fffffffffffff548);
        std::__cxx11::string::~string(local_490);
        std::allocator<char>::~allocator((allocator<char> *)&local_491);
        this = (ConfidentialTransactionContext *)local_519;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)local_519 + 1),(char *)local_28,(allocator *)this);
        cfd::core::Txid::Txid((Txid *)((long)local_519 + 0x21),(string *)((long)local_519 + 1));
        cfd::core::OutPoint::OutPoint
                  ((OutPoint *)((long)local_519 + 0x41),(Txid *)((long)local_519 + 0x21),local_2c);
        redeem_script_00 = &local_579;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)&local_579._vptr_Script + 1),(char *)in_stack_00000010,
                   (allocator *)redeem_script_00);
        cfd::core::Script::Script
                  ((Script *)
                   ((long)&local_579.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1),
                   (string *)((long)&local_579._vptr_Script + 1));
        cfd::core::SigHashType::SigHashType(&local_588,&local_184);
        cfd::ConfidentialTransactionContext::CreateSignatureHash
                  (this,local_28,redeem_script_00,in_stack_00000010,
                   (Amount *)CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                   in_stack_fffffffffffff5e0);
        cfd::core::ByteData::operator=(&local_178,(ByteData *)(local_519 + 0x69));
        cfd::core::ByteData::~ByteData((ByteData *)0x654024);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff520);
        std::__cxx11::string::~string((string *)((long)&local_579._vptr_Script + 1));
        std::allocator<char>::~allocator((allocator<char> *)&local_579);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x654058);
        cfd::core::Txid::~Txid((Txid *)0x654065);
        std::__cxx11::string::~string((string *)((long)local_519 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_519);
        cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                  (in_stack_fffffffffffff520);
      }
      else {
        paVar5 = &local_2a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a0,local_20,paVar5);
        cfd::TransactionContext::TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff520,
                   (string *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::__cxx11::string::~string(local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        paVar5 = &local_329;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_328,(char *)local_28,paVar5);
        cfd::core::Txid::Txid(&local_308,&local_328);
        cfd::core::OutPoint::OutPoint(&local_2e8,&local_308,local_2c);
        paVar5 = &local_389;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_388,(char *)in_stack_00000010,paVar5);
        version_00 = (WitnessVersion)in_stack_00000010;
        cfd::core::Script::Script(&local_368,&local_388);
        cfd::core::SigHashType::SigHashType(&local_398,&local_184);
        cfd::TransactionContext::CreateSignatureHash
                  ((TransactionContext *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                   in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                   (Amount *)CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
                   version_00);
        cfd::core::ByteData::operator=(&local_178,&local_2c0);
        cfd::core::ByteData::~ByteData((ByteData *)0x653c8c);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff520);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x653cc0);
        cfd::core::Txid::~Txid((Txid *)0x653ccd);
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
        cfd::TransactionContext::~TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff520);
      }
    }
    else {
      uVar2 = cfd::capi::IsEmptyString(in_stack_00000008);
      if ((bool)uVar2) {
        local_5a0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        local_5a0.filename = local_5a0.filename + 1;
        local_5a0.line = 0x971;
        local_5a0.funcname = "CfdCreateSighash";
        cfd::core::logger::warn<>(&local_5a0,"pubkey is null or empty.");
        local_5c2 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5c0,"Failed to parameter. pubkey is null or empty.",&local_5c1);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffff540,error_code,in_stack_fffffffffffff530);
        local_5c2 = 0;
        __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      if ((local_14b & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_870,local_20,&local_871);
        cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                  (in_stack_fffffffffffff550,in_stack_fffffffffffff548);
        std::__cxx11::string::~string(local_870);
        std::allocator<char>::~allocator((allocator<char> *)&local_871);
        paVar5 = &local_8f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8f8,(char *)local_28,paVar5);
        cfd::core::Txid::Txid(&local_8d8,&local_8f8);
        cfd::core::OutPoint::OutPoint(&local_8b8,&local_8d8,local_2c);
        paVar5 = &local_939;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_938,in_stack_00000008,paVar5);
        cfd::core::Pubkey::Pubkey(&local_918,&local_938);
        cfd::core::SigHashType::SigHashType(&local_948,&local_184);
        cfd::ConfidentialTransactionContext::CreateSignatureHash
                  (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                   (Pubkey *)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                   (Amount *)CONCAT17(uVar2,in_stack_fffffffffffff5a8),in_stack_fffffffffffff5e0);
        cfd::core::ByteData::operator=(&local_178,&local_890);
        cfd::core::ByteData::~ByteData((ByteData *)0x654884);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x654891);
        std::__cxx11::string::~string((string *)&local_938);
        std::allocator<char>::~allocator((allocator<char> *)&local_939);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x6548b8);
        cfd::core::Txid::~Txid((Txid *)0x6548c5);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
        cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                  (in_stack_fffffffffffff520);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6a0,local_20,&local_6a1);
        cfd::TransactionContext::TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff520,
                   (string *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        std::__cxx11::string::~string(local_6a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
        in_stack_fffffffffffff580 = &local_729;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_729.field_0x1,(char *)local_28,
                   (allocator *)in_stack_fffffffffffff580);
        cfd::core::Txid::Txid(&local_708,(string *)&local_729.field_0x1);
        cfd::core::OutPoint::OutPoint(&local_6e8,&local_708,local_2c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_768,in_stack_00000008,&local_769);
        cfd::core::Pubkey::Pubkey(&local_748,&local_768);
        cfd::core::SigHashType::SigHashType(&local_778,&local_184);
        cfd::TransactionContext::CreateSignatureHash
                  (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff620);
        cfd::core::ByteData::operator=(&local_178,&local_6c0);
        cfd::core::ByteData::~ByteData((ByteData *)0x654510);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x65451d);
        std::__cxx11::string::~string((string *)&local_768);
        std::allocator<char>::~allocator((allocator<char> *)&local_769);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x654544);
        cfd::core::Txid::~Txid((Txid *)0x654551);
        std::__cxx11::string::~string((string *)&local_729.field_0x1);
        std::allocator<char>::~allocator((allocator<char> *)&local_729);
        cfd::TransactionContext::~TransactionContext
                  ((TransactionContext *)in_stack_fffffffffffff520);
      }
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_968,&local_178);
    pcVar4 = cfd::capi::CreateString(in_stack_fffffffffffff580);
    *in_stack_00000030 = pcVar4;
    std::__cxx11::string::~string((string *)&local_968);
    local_4 = 0;
    cfd::core::ByteData::~ByteData((ByteData *)0x654ab7);
    return local_4;
  }
  local_a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_a0.filename = local_a0.filename + 1;
  local_a0.line = 0x928;
  local_a0.funcname = "CfdCreateSighash";
  cfd::core::logger::warn<>(&local_a0,"txid is null or empty.");
  local_c2 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Failed to parameter. txid is null or empty.",&local_c1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff540,error_code,in_stack_fffffffffffff530);
  local_c2 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateSighash(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey,
    const char* redeem_script, int64_t value_satoshi, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    WitnessVersion version = WitnessVersion::kVersionNone;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        version = WitnessVersion::kVersion0;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        version = WitnessVersion::kVersion0;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount value(value_satoshi);
    ByteData sighash_bytes;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    }

    *sighash = CreateString(sighash_bytes.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}